

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestDeferredTestReporter.cpp
# Opt level: O0

void __thiscall
UnitTest::anon_unknown_0::
TestDeferredTestReporterFixtureReportFailureSavesFailureDetailsForMultipleFailures::
TestDeferredTestReporterFixtureReportFailureSavesFailureDetailsForMultipleFailures
          (TestDeferredTestReporterFixtureReportFailureSavesFailureDetailsForMultipleFailures *this)

{
  char *suiteName;
  TestDeferredTestReporterFixtureReportFailureSavesFailureDetailsForMultipleFailures *this_local;
  
  suiteName = UnitTestSuite::GetSuiteName();
  Test::Test(&this->super_Test,"ReportFailureSavesFailureDetailsForMultipleFailures",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/UnitTest++/src/tests/TestDeferredTestReporter.cpp"
             ,0x53);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &
       PTR__TestDeferredTestReporterFixtureReportFailureSavesFailureDetailsForMultipleFailures_001840c0
  ;
  return;
}

Assistant:

TEST_FIXTURE(DeferredTestReporterFixture, ReportFailureSavesFailureDetailsForMultipleFailures)
{
    char const* failure1 = "failure 1";
    char const* failure2 = "failure 2";

    reporter.ReportTestStart(details);
    reporter.ReportFailure(details, failure1);
    reporter.ReportFailure(details, failure2);

    DeferredTestResult const& result = reporter.GetResults().at(0);
    CHECK_EQUAL(2, (int)result.failures.size());
    CHECK_EQUAL(failure1, result.failures[0].second);
    CHECK_EQUAL(failure2, result.failures[1].second);
}